

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_posixTZ(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  CVmHashEntry *str;
  os_tzinfo_t *in_RDI;
  ZoneHashEntry *entry;
  os_tzinfo_t desc;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CVmHashTable *in_stack_ffffffffffffff70;
  CVmHashTable *in_stack_ffffffffffffff78;
  ZoneHashEntrySynth *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  os_tzinfo_t *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  iVar1 = oss_parse_posix_tz(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  if (iVar1 == 0) {
    local_8 = (CVmTimeZone *)0x0;
  }
  else {
    str = CVmHashTable::find(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (str == (CVmHashEntry *)0x0) {
      operator_new(0xa0);
      ZoneHashEntrySynth::ZoneHashEntrySynth
                (in_stack_ffffffffffffff80,(char *)str,(size_t)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff6c,in_RDI);
      CVmHashTable::add(in_stack_ffffffffffffff70,
                        (CVmHashEntry *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    local_8 = tz_from_hash((CVmTimeZoneCache *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (ZoneHashEntry *)in_RDI);
  }
  return local_8;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_posixTZ(
    VMG_ const char *name, size_t len)
{
    /* 
     *   Run it through the POSIX TZ parser.  Note that the zoneinfo format
     *   uses negative offsets going west (e.g., EST-5), in contrast to the
     *   original TZ format. 
     */
    os_tzinfo_t desc;
    if (oss_parse_posix_tz(&desc, name, len, FALSE))
    {
        /* got it - check to see if it's already defined */
        ZoneHashEntry *entry = (ZoneHashEntry *)synth_tab_->find(name, len);
        if (entry == 0)
        {
            /* it's not there yet - create a new entry for it */
            entry = new ZoneHashEntrySynth(name, len, TRUE, &desc);
            synth_tab_->add(entry);
        }

        /* find or create its timezone object */
        return tz_from_hash(vmg_ entry);
    }

    /* it's not ours */
    return 0;
}